

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MyDB_Page.cc
# Opt level: O1

void __thiscall MyDB_PageBase::reduceCount(MyDB_PageBase *this)

{
  int *piVar1;
  iterator *piVar2;
  _Elt_pointer ppvVar3;
  unsigned_long *puVar4;
  _Elt_pointer puVar5;
  MyDB_BufferManager *pMVar6;
  unsigned_long local_10;
  
  piVar1 = &this->handleCount;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  local_10 = (unsigned_long)this->slotId;
  this->isPined = false;
  if (local_10 != 0xffffffffffffffff) {
    pMVar6 = this->bufferManager;
    if (this->addr == (void *)0x0) {
      puVar4 = (pMVar6->slotQueue).c.
               super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (puVar4 != (pMVar6->slotQueue).c.
                    super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_last + -1) {
        *puVar4 = local_10;
        (pMVar6->slotQueue).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur = puVar4 + 1;
        return;
      }
    }
    else {
      ppvVar3 = (pMVar6->availPageQueue).c.super__Deque_base<void_*,_std::allocator<void_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppvVar3 ==
          (pMVar6->availPageQueue).c.super__Deque_base<void_*,_std::allocator<void_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<void*,std::allocator<void*>>::_M_push_back_aux<void*const&>
                  ((deque<void*,std::allocator<void*>> *)&pMVar6->availPageQueue,&this->addr);
      }
      else {
        *ppvVar3 = this->addr;
        piVar2 = &(pMVar6->availPageQueue).c.super__Deque_base<void_*,_std::allocator<void_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish;
        piVar2->_M_cur = piVar2->_M_cur + 1;
      }
      pMVar6 = this->bufferManager;
      local_10 = (unsigned_long)this->slotId;
      puVar5 = (pMVar6->slotQueue).c.
               super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      if (puVar5 != (pMVar6->slotQueue).c.
                    super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_last + -1) {
        *puVar5 = local_10;
        (pMVar6->slotQueue).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur = puVar5 + 1;
        return;
      }
    }
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::_M_push_back_aux<unsigned_long>
              (&(pMVar6->slotQueue).c,&local_10);
  }
  return;
}

Assistant:

void MyDB_PageBase:: reduceCount() {

    this -> handleCount--;
    // if count turn to 0, decided if recycle
    if (handleCount == 0) {
        // if this page is a normal page
        if (slotId == -1) {
            // set the normal page unpined no matter if it is in the buffer
            this -> isPined = false;
        }
        // this page is anonymous
        else {
            this -> isPined = false;
            // if this page is in the buffer
            if (this -> addr != nullptr) {
                this -> bufferManager -> availPageQueue.push(this -> addr);
                this -> bufferManager -> slotQueue.push(this -> slotId);
            }
            // if this page is not in the buffer
            else {
                this -> bufferManager -> slotQueue.push(this -> slotId);
            }
            //delete this;
        }
    }
}